

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

int __thiscall MD5::init(MD5 *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  element_type *peVar2;
  shared_ptr<QPDFCryptoImpl> local_20;
  MD5 *local_10;
  MD5 *this_local;
  
  local_10 = this;
  QPDFCryptoProvider::getImpl();
  std::shared_ptr<QPDFCryptoImpl>::operator=(&this->crypto,&local_20);
  std::shared_ptr<QPDFCryptoImpl>::~shared_ptr(&local_20);
  peVar2 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  iVar1 = (*peVar2->_vptr_QPDFCryptoImpl[3])();
  return iVar1;
}

Assistant:

void
MD5::init()
{
    this->crypto = QPDFCryptoProvider::getImpl();
    this->crypto->MD5_init();
}